

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

TPZManVector<int,_27> * __thiscall
TPZManVector<int,_27>::operator=(TPZManVector<int,_27> *this,initializer_list<int> *list)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  int *piVar4;
  const_iterator piVar5;
  initializer_list<int> *in_RSI;
  TPZManVector<int,_27> *in_RDI;
  const_iterator it;
  int *aux;
  const_iterator it_end;
  size_t size;
  initializer_list<int> *in_stack_ffffffffffffffc0;
  const_iterator local_30;
  int *local_28;
  
  sVar2 = std::initializer_list<int>::size(in_RSI);
  if ((((ulong)(in_RDI->super_TPZVec<int>).fNAlloc < sVar2) &&
      ((in_RDI->super_TPZVec<int>).fStore != (int *)0x0)) &&
     ((in_RDI->super_TPZVec<int>).fStore != in_RDI->fExtAlloc)) {
    in_stack_ffffffffffffffc0 = (initializer_list<int> *)(in_RDI->super_TPZVec<int>).fStore;
    if (in_stack_ffffffffffffffc0 != (initializer_list<int> *)0x0) {
      operator_delete__(in_stack_ffffffffffffffc0);
    }
    (in_RDI->super_TPZVec<int>).fStore = (int *)0x0;
    (in_RDI->super_TPZVec<int>).fNAlloc = 0;
  }
  if (sVar2 < 0x1c) {
    if (((in_RDI->super_TPZVec<int>).fStore != in_RDI->fExtAlloc) &&
       (piVar4 = (in_RDI->super_TPZVec<int>).fStore, piVar4 != (int *)0x0)) {
      operator_delete__(piVar4);
    }
    (in_RDI->super_TPZVec<int>).fNAlloc = 0;
    (in_RDI->super_TPZVec<int>).fStore = in_RDI->fExtAlloc;
    (in_RDI->super_TPZVec<int>).fNElements = sVar2;
  }
  else if ((ulong)(in_RDI->super_TPZVec<int>).fNAlloc < sVar2) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    piVar4 = (int *)operator_new__(uVar3);
    (in_RDI->super_TPZVec<int>).fStore = piVar4;
    (in_RDI->super_TPZVec<int>).fNAlloc = sVar2;
    (in_RDI->super_TPZVec<int>).fNElements = sVar2;
  }
  else {
    (in_RDI->super_TPZVec<int>).fNElements = sVar2;
  }
  piVar5 = std::initializer_list<int>::end(in_stack_ffffffffffffffc0);
  local_28 = (in_RDI->super_TPZVec<int>).fStore;
  for (local_30 = std::initializer_list<int>::begin(in_RSI); local_30 != piVar5;
      local_30 = local_30 + 1) {
    *local_28 = *local_30;
    local_28 = local_28 + 1;
  }
  return in_RDI;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const std::initializer_list<T>& list) {
	size_t size = list.size();

	if (size > this->fNAlloc && this->fStore && this->fStore != this->fExtAlloc) {
		delete[] this->fStore;
		this->fStore = 0;
		this->fNAlloc = 0;
	}

	if (size <= NumExtAlloc) {
		if (this->fStore != fExtAlloc) {
			delete[]this->fStore;
		}
		this->fNAlloc = 0;
		this->fStore = fExtAlloc;
		this->fNElements = size;
	}
	else if (this->fNAlloc >= size) {
		this->fNElements = size;
	}
	else {
		this->fStore = new T[size];
		this->fNAlloc = size;
		this->fNElements = size;
	}

	auto it_end = list.end();
	T* aux = this->fStore;
	for (auto it = list.begin(); it != it_end; it++, aux++)
		*aux = *it;

	return *this;
}